

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor-read.c
# Opt level: O2

int coda_cursor_read_complex_double_pairs_array
              (coda_cursor *cursor,double *dst,coda_array_ordering array_ordering)

{
  int iVar1;
  coda_type *pcVar2;
  char *pcVar3;
  undefined8 uVar4;
  
  if (((cursor == (coda_cursor *)0x0) || (cursor->n < 1)) ||
     (pcVar2 = (coda_type *)cursor->stack[cursor->n - 1].type, pcVar2 == (coda_type *)0x0)) {
    pcVar3 = "invalid cursor argument (%s:%u)";
    uVar4 = 0x1611;
  }
  else {
    if (dst != (double *)0x0) {
      if (99 < pcVar2->format) {
        pcVar2 = *(coda_type **)&pcVar2->type_class;
      }
      if (pcVar2->type_class != coda_array_class) {
        pcVar3 = coda_type_get_class_name(pcVar2->type_class);
        coda_set_error(-0x69,"cursor does not refer to an array (current type is %s)",pcVar3);
        return -1;
      }
      iVar1 = read_array(cursor,read_double_pair,(uint8_t *)dst,0x10,array_ordering);
      return iVar1;
    }
    pcVar3 = "dst argument is NULL (%s:%u)";
    uVar4 = 0x1616;
  }
  coda_set_error(-100,pcVar3,
                 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor-read.c"
                 ,uVar4);
  return -1;
}

Assistant:

LIBCODA_API int coda_cursor_read_complex_double_pairs_array(const coda_cursor *cursor, double *dst,
                                                            coda_array_ordering array_ordering)
{
    coda_type *type;

    if (cursor == NULL || cursor->n <= 0 || cursor->stack[cursor->n - 1].type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid cursor argument (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (dst == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "dst argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    type = coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);
    if (type->type_class != coda_array_class)
    {
        coda_set_error(CODA_ERROR_INVALID_TYPE, "cursor does not refer to an array (current type is %s)",
                       coda_type_get_class_name(type->type_class));
        return -1;
    }
    return read_array(cursor, (read_function)&read_double_pair, (uint8_t *)dst, 2 * sizeof(double), array_ordering);
}